

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_xor(_Bool copy_on_write)

{
  _Bool _Var1;
  roaring_bitmap_t *prVar2;
  roaring_bitmap_t *prVar3;
  roaring_bitmap_t *prVar4;
  roaring_bitmap_t *r1_00;
  roaring_bitmap_t *r_00;
  char *file;
  byte in_DIL;
  int i_3;
  _Bool is_equal;
  roaring_bitmap_t *result;
  roaring_bitmap_t *expected;
  int j;
  int i_2;
  roaring_bitmap_t *r [10];
  int i_1;
  int ansctr;
  roaring_bitmap_t *r1_xor_r2;
  uint32_t i;
  roaring_bitmap_t *r2;
  roaring_bitmap_t *r1;
  int in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  uint32_t val;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  roaring_bitmap_t *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int iVar5;
  int iVar6;
  double in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  roaring_bitmap_t *in_stack_ffffffffffffff90;
  uint local_30;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar7;
  
  _Var1 = (_Bool)(in_DIL & 1);
  prVar2 = roaring_bitmap_create();
  roaring_bitmap_set_copy_on_write(prVar2,_Var1);
  prVar2 = roaring_bitmap_create();
  roaring_bitmap_set_copy_on_write(prVar2,_Var1);
  for (uVar7 = 0; uVar7 < 300; uVar7 = uVar7 + 1) {
    if ((uVar7 & 1) == 0) {
      roaring_bitmap_add(in_stack_ffffffffffffff90,
                         (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    }
    if (uVar7 % 3 == 0) {
      roaring_bitmap_add(in_stack_ffffffffffffff90,
                         (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    }
  }
  prVar3 = roaring_bitmap_xor(prVar2,(roaring_bitmap_t *)CONCAT44(uVar7,in_stack_ffffffffffffffe0));
  roaring_bitmap_set_copy_on_write(prVar3,_Var1);
  for (local_30 = 0; (int)local_30 < 300; local_30 = local_30 + 1) {
    val = (uint32_t)((ulong)in_stack_ffffffffffffff50 >> 0x20);
    if ((((int)local_30 % 2 == 0) || ((int)local_30 % 3 == 0)) && ((int)local_30 % 6 != 0)) {
      _Var1 = roaring_bitmap_contains
                        ((roaring_bitmap_t *)
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),val);
      if (!_Var1) {
        printf("missing %d\n",(ulong)local_30);
      }
    }
    else {
      _Var1 = roaring_bitmap_contains
                        ((roaring_bitmap_t *)
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),val);
      if (_Var1) {
        printf("surplus %d\n",(ulong)local_30);
      }
    }
  }
  roaring_bitmap_get_cardinality(in_stack_ffffffffffffff60);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff60,
                    CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                    in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  roaring_bitmap_free((roaring_bitmap_t *)0x106820);
  roaring_bitmap_free((roaring_bitmap_t *)0x10682d);
  roaring_bitmap_free((roaring_bitmap_t *)0x10683a);
  prVar3 = gen_bitmap(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                      (int)in_stack_ffffffffffffff68);
  prVar4 = gen_bitmap(in_stack_ffffffffffffff80,(double)prVar3,in_stack_ffffffffffffff74,
                      in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                      (int)in_stack_ffffffffffffff68);
  gen_bitmap((double)prVar4,(double)prVar3,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
             (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68);
  gen_bitmap((double)prVar4,(double)prVar3,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
             (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68);
  gen_bitmap((double)prVar4,(double)prVar3,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
             (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68);
  gen_bitmap((double)prVar4,(double)prVar3,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
             (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68);
  gen_bitmap((double)prVar4,(double)prVar3,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
             (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68);
  gen_bitmap((double)prVar4,(double)prVar3,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
             (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68);
  prVar3 = gen_bitmap((double)prVar4,(double)prVar3,in_stack_ffffffffffffff74,
                      in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                      (int)in_stack_ffffffffffffff68);
  prVar4 = (roaring_bitmap_t *)0x0;
  iVar5 = 0;
  while (iVar6 = iVar5, *(long *)(&stack0xffffffffffffff78 + (long)iVar5 * 8) != 0) {
    while (*(long *)(&stack0xffffffffffffff78 + (long)iVar5 * 8) != 0) {
      r1_00 = synthesized_xor(prVar4,prVar3);
      r_00 = roaring_bitmap_xor(prVar2,(roaring_bitmap_t *)CONCAT44(uVar7,in_stack_ffffffffffffffe0)
                               );
      file = (char *)roaring_bitmap_get_cardinality(r_00);
      roaring_bitmap_xor_cardinality
                (r_00,(roaring_bitmap_t *)
                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      _assert_true((unsigned_long)r_00,
                   (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),file,
                   in_stack_ffffffffffffff4c);
      _Var1 = roaring_bitmap_equals(r1_00,r_00);
      in_stack_ffffffffffffff5c = CONCAT13(_Var1,(int3)in_stack_ffffffffffffff5c);
      _assert_true((unsigned_long)r_00,
                   (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),file,
                   in_stack_ffffffffffffff4c);
      roaring_bitmap_free((roaring_bitmap_t *)0x106aa4);
      roaring_bitmap_free((roaring_bitmap_t *)0x106aae);
      iVar5 = iVar5 + 1;
    }
    iVar5 = iVar6 + 1;
  }
  iVar5 = 0;
  while (*(long *)(&stack0xffffffffffffff78 + (long)iVar5 * 8) != 0) {
    roaring_bitmap_free((roaring_bitmap_t *)0x106af4);
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

void test_xor(bool copy_on_write) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r1, copy_on_write);
    roaring_bitmap_t *r2 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r2, copy_on_write);

    for (uint32_t i = 0; i < 300; ++i) {
        if (i % 2 == 0) roaring_bitmap_add(r1, i);
        if (i % 3 == 0) roaring_bitmap_add(r2, i);
    }

    roaring_bitmap_t *r1_xor_r2 = roaring_bitmap_xor(r1, r2);
    roaring_bitmap_set_copy_on_write(r1_xor_r2, copy_on_write);

    int ansctr = 0;
    for (int i = 0; i < 300; ++i) {
        if (((i % 2 == 0) || (i % 3 == 0)) && (i % 6 != 0)) {
            ansctr++;
            if (!roaring_bitmap_contains(r1_xor_r2, i))
                printf("missing %d\n", i);
        } else if (roaring_bitmap_contains(r1_xor_r2, i))
            printf("surplus %d\n", i);
    }

    assert_int_equal(roaring_bitmap_get_cardinality(r1_xor_r2), ansctr);

    roaring_bitmap_free(r1_xor_r2);
    roaring_bitmap_free(r2);
    roaring_bitmap_free(r1);

    // some tougher tests on synthetic data

    roaring_bitmap_t *r[] = {
        // ascending density, last containers might be runs
        gen_bitmap(0.0, 1e-6, 1, 0, 0, 1000000),
        // descending density, first containers might be runs
        gen_bitmap(1.0, -1e-6, 1, 0, 0, 1000000),
        // uniformly rather sparse
        gen_bitmap(1e-5, 0.0, 1, 0, 0, 2000000),
        // uniformly rather sparse with runs
        gen_bitmap(1e-5, 0.0, 3, 0, 0, 2000000),
        // uniformly rather dense
        gen_bitmap(1e-1, 0.0, 1, 0, 0, 2000000),
        // ascending density but never too dense
        gen_bitmap(0.001, 1e-7, 1, 0, 0, 1000000),
        // ascending density but very sparse
        gen_bitmap(0.0, 1e-10, 1, 0, 0, 1000000),
        // descending with a gap
        gen_bitmap(0.5, -1e-6, 1, 600000, 800000, 1000000),
        //  gap elsewhere
        gen_bitmap(1, -1e-6, 1, 300000, 500000, 1000000),
        0  // sentinel
    };

    for (int i = 0; r[i]; ++i) {
        for (int j = i; r[j]; ++j) {
            roaring_bitmap_t *expected = synthesized_xor(r[i], r[j]);
            roaring_bitmap_t *result = roaring_bitmap_xor(r[i], r[j]);
            assert_true(roaring_bitmap_get_cardinality(result) ==
                        roaring_bitmap_xor_cardinality(r[i], r[j]));

            bool is_equal = roaring_bitmap_equals(expected, result);

            assert_true(is_equal);
            roaring_bitmap_free(expected);
            roaring_bitmap_free(result);
        }
    }
    for (int i = 0; r[i]; ++i) roaring_bitmap_free(r[i]);
}